

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

void updateLtlStoreOfNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *tempLtlStore)

{
  void *Entry;
  int i;
  
  if (tempLtlStore != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < tempLtlStore->nSize; i = i + 1) {
      Entry = Vec_PtrEntry(tempLtlStore,i);
      Vec_PtrPush(pNtk->vLtlProperties,Entry);
    }
    return;
  }
  __assert_fail("tempLtlStore != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                ,0xde,"void updateLtlStoreOfNtk(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

void updateLtlStoreOfNtk( Abc_Ntk_t *pNtk, Vec_Ptr_t *tempLtlStore )
{
	int i;
	char *pFormula;

	assert( tempLtlStore != NULL );
	Vec_PtrForEachEntry( char *, tempLtlStore, pFormula, i )
		Vec_PtrPush( pNtk->vLtlProperties, pFormula );
}